

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O1

void __thiscall
CoreML::TreeEnsembleBase::setDefaultPredictionValue
          (TreeEnsembleBase *this,vector<double,_std::allocator<double>_> *v)

{
  double dVar1;
  int iVar2;
  pointer pdVar3;
  TreeEnsembleParameters *pTVar4;
  vector<double,_std::allocator<double>_> *__range1;
  pointer pdVar5;
  
  (this->tree_parameters->basepredictionvalue_).current_size_ = 0;
  pdVar3 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (pdVar5 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start; pdVar5 != pdVar3; pdVar5 = pdVar5 + 1) {
    dVar1 = *pdVar5;
    pTVar4 = this->tree_parameters;
    iVar2 = (pTVar4->basepredictionvalue_).total_size_;
    if ((pTVar4->basepredictionvalue_).current_size_ == iVar2) {
      google::protobuf::RepeatedField<double>::Reserve(&pTVar4->basepredictionvalue_,iVar2 + 1);
    }
    iVar2 = (pTVar4->basepredictionvalue_).current_size_;
    (pTVar4->basepredictionvalue_).current_size_ = iVar2 + 1;
    ((pTVar4->basepredictionvalue_).rep_)->elements[iVar2] = dVar1;
  }
  this->tree_parameters->numpredictiondimensions_ =
       (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3;
  return;
}

Assistant:

void TreeEnsembleBase::setDefaultPredictionValue(const std::vector<double>& v) {
        tree_parameters->clear_basepredictionvalue();
        for(double e : v) {
            tree_parameters->add_basepredictionvalue(e);
        }

        tree_parameters->set_numpredictiondimensions(v.size());
    }